

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void no_label::parse_no_label
               (parser *param_1,shared_data *param_2,void *param_3,v_array<substring> *words)

{
  substring *psVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  substring s;
  
  if (words->_end != words->_begin) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," is too many tokens for a simple label: ");
    uVar2 = 0;
    while( true ) {
      uVar4 = (ulong)uVar2;
      psVar1 = words->_begin;
      if ((ulong)((long)words->_end - (long)psVar1 >> 4) <= uVar4) break;
      s.end = psVar1[uVar4].end;
      s.begin = psVar1[uVar4].begin;
      print_substring(s);
      uVar2 = uVar2 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }